

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

void __thiscall ThreadedImageSaver::runThread(ThreadedImageSaver *this)

{
  bool bVar1;
  long in_RDI;
  type img;
  unique_lock<std::mutex> l;
  pair<Image,_std::filesystem::__cxx11::path> *in_stack_ffffffffffffff38;
  pair<Image,_std::filesystem::__cxx11::path> *in_stack_ffffffffffffff40;
  path *filename;
  Image *in_stack_ffffffffffffff50;
  allocator<char> local_91;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  pair<Image,_std::filesystem::__cxx11::path> local_60;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff40,
             (mutex_type *)in_stack_ffffffffffffff38);
  while (((*(byte *)(in_RDI + 0x88) ^ 0xff) & 1) != 0) {
    std::condition_variable::wait((unique_lock *)(in_RDI + 0x30));
    while (bVar1 = std::
                   vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
                   ::empty((vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
                            *)in_stack_ffffffffffffff50), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
      ::back((vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
              *)in_stack_ffffffffffffff40);
      std::pair<Image,_std::filesystem::__cxx11::path>::pair
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::
      vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
      ::pop_back((vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
                  *)0x133d2c);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff40 = &local_60;
      filename = &local_60.second;
      in_stack_ffffffffffffff50 = (Image *)&local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      Image::writePNG(in_stack_ffffffffffffff50,filename,(string *)in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      std::allocator<char>::~allocator(&local_91);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      std::pair<Image,_std::filesystem::__cxx11::path>::~pair(in_stack_ffffffffffffff40);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void ThreadedImageSaver::runThread() {
	std::unique_lock<std::mutex> l(mtx);
	while (!stopped) {
		cv.wait(l);
		while (!images.empty()) {
			auto img = std::move(images.back());
			images.pop_back();
			l.unlock();
			img.first.writePNG(img.second);
			l.lock();
		}
	}
}